

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

char32_t anon_unknown.dwarf_187963::decodeUtf8Character(string *source,size_t *index)

{
  size_t sVar1;
  pointer pcVar2;
  char32_t cVar3;
  ulong uVar4;
  bool bVar5;
  
  sVar1 = *index;
  *index = sVar1 + 1;
  pcVar2 = (source->_M_dataplus)._M_p;
  cVar3 = (char32_t)pcVar2[sVar1];
  if ((cVar3 & 0xe0U) == 0xc0) {
    cVar3 = cVar3 & 0x1f;
    uVar4 = 1;
  }
  else {
    bVar5 = (cVar3 & 0xf0U) == 0xe0;
    if (bVar5) {
      cVar3 = cVar3 & 0xf;
    }
    uVar4 = (ulong)((uint)bVar5 * 2);
  }
  if (uVar4 != 0) {
    sVar1 = *index;
    do {
      *index = sVar1 + 1;
      cVar3 = (byte)pcVar2[sVar1] & 0x3f | cVar3 << 6;
      uVar4 = uVar4 - 1;
      sVar1 = sVar1 + 1;
    } while (uVar4 != 0);
    return cVar3;
  }
  return cVar3;
}

Assistant:

char32_t decodeUtf8Character(const std::string &source, size_t &index)
	{
		size_t extraBytes = 0;
		int value = source[index++];

		if ((value & 0xE0) == 0xC0)
		{
			extraBytes = 1;
			value &= 0x1F;
		} else if ((value & 0xF0) == 0xE0)
		{
			extraBytes = 2;
			value &= 0x0F;
		}

		for (size_t i = 0; i < extraBytes; i++)
		{
			int b = source[index++];
			value = (value << 6) | (b & 0x3F);
		}

		return char32_t(value);
	}